

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O1

vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
* vkt::pipeline::anon_unknown_0::makeGraphicsPipelines
            (vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
             *__return_storage_ptr__,DeviceInterface *vk,VkDevice device,deUint32 numSubpasses,
            VkPipelineLayout pipelineLayout,VkRenderPass renderPass,VkShaderModule vertexModule,
            VkShaderModule fragmentModule,IVec2 *renderSize,VkSampleCountFlagBits numSamples,
            VkPrimitiveTopology topology)

{
  deInt32 *pdVar1;
  iterator iVar2;
  VkResult result;
  deUint64 *pdVar3;
  pointer pHVar4;
  deUint32 dVar5;
  vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
  rawPipelines;
  VkGraphicsPipelineCreateInfo createInfo;
  VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo;
  VkPipelineViewportStateCreateInfo pipelineViewportStateInfo;
  VkPipelineVertexInputStateCreateInfo vertexInputStateInfo;
  VkPipelineShaderStageCreateInfo pShaderStages [2];
  VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo;
  VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo;
  VkVertexInputBindingDescription vertexInputBindingDescription;
  VkRect2D scissor;
  VkViewport viewport;
  VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState;
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [2];
  allocator_type local_3a9;
  void *local_3a8;
  iterator iStack_3a0;
  VkGraphicsPipelineCreateInfo *local_398;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
  *local_390;
  Handle<(vk::HandleType)18> local_388;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_380;
  DeviceInterface *local_360;
  VkDevice local_358;
  vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_> local_350
  ;
  VkGraphicsPipelineCreateInfo local_338;
  VkPipelineInputAssemblyStateCreateInfo local_2a8;
  VkPipelineViewportStateCreateInfo local_288;
  VkPipelineVertexInputStateCreateInfo local_258;
  VkPipelineShaderStageCreateInfo local_228;
  undefined4 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  deUint64 local_1e0;
  char *local_1d8;
  undefined8 local_1d0;
  VkPipelineMultisampleStateCreateInfo local_1c8;
  VkPipelineRasterizationStateCreateInfo local_198;
  VkPipelineColorBlendStateCreateInfo local_150;
  VkPipelineDepthStencilStateCreateInfo local_118;
  VkVertexInputBindingDescription local_b0;
  VkRect2D local_a0;
  VkViewport local_90;
  VkPipelineColorBlendAttachmentState local_78;
  VkVertexInputAttributeDescription local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_258.pVertexBindingDescriptions = &local_b0;
  local_b0.binding = 0;
  local_b0.stride = 0x20;
  local_b0.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  local_258.pVertexAttributeDescriptions = &local_58;
  local_48 = 1;
  uStack_40 = 0x100000006d;
  local_58.location = 0;
  local_58.binding = 0;
  local_58.format = VK_FORMAT_R32G32B32A32_SFLOAT;
  local_58.offset = 0;
  local_258.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  local_258.pNext = (void *)0x0;
  local_258.flags = 0;
  local_258.vertexBindingDescriptionCount = 1;
  local_258.vertexAttributeDescriptionCount = 2;
  local_2a8.pNext = (void *)0x0;
  local_2a8.primitiveRestartEnable = 0;
  local_2a8._28_4_ = 0;
  local_2a8.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  local_2a8._4_4_ = 0;
  local_2a8._16_8_ = (ulong)topology << 0x20;
  local_90.width = (float)renderSize->m_data[0];
  local_a0.extent = *(VkExtent2D *)renderSize->m_data;
  local_90.height = (float)renderSize->m_data[1];
  local_288.pViewports = &local_90;
  local_90.x = 0.0;
  local_90.y = 0.0;
  local_90.minDepth = 0.0;
  local_90.maxDepth = 1.0;
  local_288.pScissors = &local_a0;
  local_a0.offset.x = 0;
  local_a0.offset.y = 0;
  local_288.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  local_288.pNext = (void *)0x0;
  local_288.flags = 0;
  local_288.viewportCount = 1;
  local_288.scissorCount = 1;
  local_198.pNext = (void *)0x0;
  local_198.depthBiasClamp = 0.0;
  local_198.depthBiasSlopeFactor = 0.0;
  local_198.cullMode = 0;
  local_198.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  local_198.depthBiasEnable = 0;
  local_198.depthBiasConstantFactor = 0.0;
  local_198.flags = 0;
  local_198.depthClampEnable = 0;
  local_198.rasterizerDiscardEnable = 0;
  local_198.polygonMode = VK_POLYGON_MODE_FILL;
  local_198.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  local_198._4_4_ = 0;
  local_198.lineWidth = 1.0;
  local_198._60_4_ = 0;
  local_1c8.pNext = (void *)0x0;
  local_1c8.sampleShadingEnable = 0;
  local_1c8.minSampleShading = 0.0;
  local_1c8.pSampleMask = (VkSampleMask *)0x0;
  local_1c8.alphaToCoverageEnable = 0;
  local_1c8.alphaToOneEnable = 0;
  local_1c8.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  local_1c8._4_4_ = 0;
  local_1c8._16_8_ = (ulong)numSamples << 0x20;
  local_118.sType = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  local_118.pNext = (void *)0x0;
  local_118.flags = 0;
  local_118.depthTestEnable = 0;
  local_118.depthWriteEnable = 0;
  local_118.depthCompareOp = VK_COMPARE_OP_LESS;
  local_118.depthBoundsTestEnable = 0;
  local_118.stencilTestEnable = 0;
  local_118.front.failOp = VK_STENCIL_OP_KEEP;
  local_118.front.passOp = VK_STENCIL_OP_KEEP;
  local_118.front.depthFailOp = VK_STENCIL_OP_KEEP;
  local_118.front.compareOp = VK_COMPARE_OP_ALWAYS;
  local_118.front.compareMask = 0;
  local_118.front.writeMask = 0;
  local_118.front.reference = 0;
  local_118.back.failOp = VK_STENCIL_OP_KEEP;
  local_118.back.passOp = VK_STENCIL_OP_KEEP;
  local_118.back.depthFailOp = VK_STENCIL_OP_KEEP;
  local_118.back.compareOp = VK_COMPARE_OP_ALWAYS;
  local_118.back.compareMask = 0;
  local_118.back.writeMask = 0;
  local_118.back.reference = 0;
  local_118.minDepthBounds = 0.0;
  local_118.maxDepthBounds = 1.0;
  local_150.pAttachments = &local_78;
  local_78.srcAlphaBlendFactor = VK_BLEND_FACTOR_ONE;
  local_78.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  local_78.alphaBlendOp = VK_BLEND_OP_ADD;
  local_78.colorWriteMask = 0xf;
  local_78.blendEnable = 0;
  local_78.srcColorBlendFactor = VK_BLEND_FACTOR_ONE;
  local_78.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  local_78.colorBlendOp = VK_BLEND_OP_ADD;
  local_150.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_150.pNext = (void *)0x0;
  local_150.flags = 0;
  local_150.logicOpEnable = 0;
  local_150.logicOp = VK_LOGIC_OP_COPY;
  local_150.attachmentCount = 1;
  local_150.blendConstants[0] = 0.0;
  local_150.blendConstants[1] = 0.0;
  local_150.blendConstants[2] = 0.0;
  local_150.blendConstants[3] = 0.0;
  local_228.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  local_228.pNext = (void *)0x0;
  local_228.flags = 0;
  local_228.stage = VK_SHADER_STAGE_VERTEX_BIT;
  local_228.module.m_internal = vertexModule.m_internal;
  local_228.pName = "main";
  local_228.pSpecializationInfo = (VkSpecializationInfo *)0x0;
  local_1f8 = 0x12;
  local_1f0 = 0;
  local_1e8 = 0x1000000000;
  local_1e0 = fragmentModule.m_internal;
  local_1d8 = "main";
  local_1d0 = 0;
  local_398 = (VkGraphicsPipelineCreateInfo *)0x0;
  local_3a8 = (void *)0x0;
  iStack_3a0._M_current = (VkGraphicsPipelineCreateInfo *)0x0;
  local_338._0_8_ = 0;
  local_390 = (vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
               *)__return_storage_ptr__;
  local_360 = vk;
  local_358 = device;
  std::vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>::
  vector(&local_350,(ulong)numSubpasses,(value_type *)&local_338,&local_3a9);
  iVar2._M_current = iStack_3a0._M_current;
  local_338.flags = (uint)(1 < numSubpasses) * 2;
  local_338.sType = 0x1c;
  local_338.pNext = (SharedPtrStateBase *)0x0;
  local_338.stageCount = 2;
  local_338.pStages = &local_228;
  local_338.pVertexInputState = &local_258;
  local_338.pInputAssemblyState = &local_2a8;
  local_338.pTessellationState = (VkPipelineTessellationStateCreateInfo *)0x0;
  local_338.pViewportState = &local_288;
  local_338.pRasterizationState = &local_198;
  local_338.pMultisampleState = &local_1c8;
  local_338.pDepthStencilState = &local_118;
  local_338.pColorBlendState = &local_150;
  local_338.pDynamicState = (VkPipelineDynamicStateCreateInfo *)0x0;
  local_338.subpass = 0;
  local_338.basePipelineHandle.m_internal = 0;
  local_338.basePipelineIndex = -1;
  local_338.layout.m_internal = pipelineLayout.m_internal;
  local_338.renderPass.m_internal = renderPass.m_internal;
  if (iStack_3a0._M_current == local_398) {
    std::vector<vk::VkGraphicsPipelineCreateInfo,std::allocator<vk::VkGraphicsPipelineCreateInfo>>::
    _M_realloc_insert<vk::VkGraphicsPipelineCreateInfo_const&>
              ((vector<vk::VkGraphicsPipelineCreateInfo,std::allocator<vk::VkGraphicsPipelineCreateInfo>>
                *)&local_3a8,iStack_3a0,&local_338);
  }
  else {
    memcpy(iStack_3a0._M_current,&local_338,0x90);
    iStack_3a0._M_current = iVar2._M_current + 1;
  }
  local_338.flags = 4;
  local_338.basePipelineIndex = 0;
  if (1 < numSubpasses) {
    dVar5 = 1;
    do {
      iVar2._M_current = iStack_3a0._M_current;
      local_338.subpass = dVar5;
      if (iStack_3a0._M_current == local_398) {
        std::
        vector<vk::VkGraphicsPipelineCreateInfo,std::allocator<vk::VkGraphicsPipelineCreateInfo>>::
        _M_realloc_insert<vk::VkGraphicsPipelineCreateInfo_const&>
                  ((vector<vk::VkGraphicsPipelineCreateInfo,std::allocator<vk::VkGraphicsPipelineCreateInfo>>
                    *)&local_3a8,iStack_3a0,&local_338);
      }
      else {
        memcpy(iStack_3a0._M_current,&local_338,0x90);
        iStack_3a0._M_current = iVar2._M_current + 1;
      }
      dVar5 = dVar5 + 1;
    } while (numSubpasses != dVar5);
  }
  result = (*local_360->_vptr_DeviceInterface[0x30])
                     (local_360,local_358,0,
                      (ulong)(uint)((int)((ulong)((long)iStack_3a0._M_current - (long)local_3a8) >>
                                         4) * 0x38e38e39),local_3a8,0,
                      local_350.
                      super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  ::vk::checkResult(result,
                    "vk.createGraphicsPipelines(device, DE_NULL, static_cast<deUint32>(graphicsPipelineInfos.size()), &graphicsPipelineInfos[0], DE_NULL, &rawPipelines[0])"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineMultisampleImageTests.cpp"
                    ,0x132);
  *(undefined8 *)local_390 = 0;
  *(pointer *)(local_390 + 8) = (pointer)0x0;
  *(pointer *)(local_390 + 0x10) = (pointer)0x0;
  if (local_350.
      super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_350.
      super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pHVar4 = local_350.
             super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_388.m_internal =
           (deUint64)::vk::refdetails::check<vk::Handle<(vk::HandleType)18>>(pHVar4->m_internal);
      DStack_380.m_deviceIface = local_360;
      DStack_380.m_device = local_358;
      DStack_380.m_allocator = (VkAllocationCallbacks *)0x0;
      pdVar3 = (deUint64 *)operator_new(0x20);
      pdVar3[2] = (deUint64)DStack_380.m_device;
      pdVar3[3] = (deUint64)DStack_380.m_allocator;
      *pdVar3 = local_388.m_internal;
      pdVar3[1] = (deUint64)DStack_380.m_deviceIface;
      local_388.m_internal = 0;
      DStack_380.m_deviceIface = (DeviceInterface *)0x0;
      DStack_380.m_device = (VkDevice)0x0;
      DStack_380.m_allocator = (VkAllocationCallbacks *)0x0;
      local_338.pNext = (SharedPtrStateBase *)0x0;
      local_338._0_8_ = pdVar3;
      local_338.pNext = operator_new(0x20);
      ((SharedPtrStateBase *)local_338.pNext)->strongRefCount = 0;
      ((SharedPtrStateBase *)local_338.pNext)->weakRefCount = 0;
      ((SharedPtrStateBase *)local_338.pNext)->_vptr_SharedPtrStateBase =
           (_func_int **)&PTR__SharedPtrState_00d1e0d0;
      ((SharedPtrStateBase *)((long)local_338.pNext + 0x10))->_vptr_SharedPtrStateBase =
           (_func_int **)pdVar3;
      ((SharedPtrStateBase *)local_338.pNext)->strongRefCount = 1;
      ((SharedPtrStateBase *)local_338.pNext)->weakRefCount = 1;
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>>
      ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>>>>
                (local_390,
                 (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> *)&local_338);
      if ((SharedPtrStateBase *)local_338.pNext != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = (deInt32 *)((long)local_338.pNext + 8);
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_338._0_8_ = (deUint64 *)0x0;
          (**(code **)(*local_338.pNext + 0x10))();
        }
        LOCK();
        pdVar1 = (deInt32 *)((long)local_338.pNext + 0xc);
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          if ((SharedPtrStateBase *)local_338.pNext != (SharedPtrStateBase *)0x0) {
            (**(code **)(*local_338.pNext + 8))();
          }
          local_338.pNext = (SharedPtrStateBase *)0x0;
        }
      }
      if (local_388.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                  (&DStack_380,(VkPipeline)local_388.m_internal);
      }
      DStack_380.m_device = (VkDevice)0x0;
      DStack_380.m_allocator = (VkAllocationCallbacks *)0x0;
      local_388.m_internal = 0;
      DStack_380.m_deviceIface = (DeviceInterface *)0x0;
      pHVar4 = pHVar4 + 1;
    } while (pHVar4 != local_350.
                       super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_350.
      super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_350.
                    super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_350.
                          super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_350.
                          super__Vector_base<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3a8 != (void *)0x0) {
    operator_delete(local_3a8,(long)local_398 - (long)local_3a8);
  }
  return (vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
          *)local_390;
}

Assistant:

std::vector<PipelineSp> makeGraphicsPipelines (const DeviceInterface&		vk,
											   const VkDevice				device,
											   const deUint32				numSubpasses,
											   const VkPipelineLayout		pipelineLayout,
											   const VkRenderPass			renderPass,
											   const VkShaderModule			vertexModule,
											   const VkShaderModule			fragmentModule,
											   const IVec2					renderSize,
											   const VkSampleCountFlagBits	numSamples,
											   const VkPrimitiveTopology	topology)
{
	const VkVertexInputBindingDescription vertexInputBindingDescription =
	{
		0u,								// uint32_t				binding;
		sizeof(Vertex4RGBA),			// uint32_t				stride;
		VK_VERTEX_INPUT_RATE_VERTEX,	// VkVertexInputRate	inputRate;
	};

	const VkVertexInputAttributeDescription vertexInputAttributeDescriptions[] =
	{
		{
			0u,									// uint32_t			location;
			0u,									// uint32_t			binding;
			VK_FORMAT_R32G32B32A32_SFLOAT,		// VkFormat			format;
			0u,									// uint32_t			offset;
		},
		{
			1u,									// uint32_t			location;
			0u,									// uint32_t			binding;
			VK_FORMAT_R32G32B32A32_SFLOAT,		// VkFormat			format;
			sizeof(Vec4),						// uint32_t			offset;
		},
	};

	const VkPipelineVertexInputStateCreateInfo vertexInputStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,		// VkStructureType                             sType;
		DE_NULL,														// const void*                                 pNext;
		(VkPipelineVertexInputStateCreateFlags)0,						// VkPipelineVertexInputStateCreateFlags       flags;
		1u,																// uint32_t                                    vertexBindingDescriptionCount;
		&vertexInputBindingDescription,									// const VkVertexInputBindingDescription*      pVertexBindingDescriptions;
		DE_LENGTH_OF_ARRAY(vertexInputAttributeDescriptions),			// uint32_t                                    vertexAttributeDescriptionCount;
		vertexInputAttributeDescriptions,								// const VkVertexInputAttributeDescription*    pVertexAttributeDescriptions;
	};

	const VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,	// VkStructureType                             sType;
		DE_NULL,														// const void*                                 pNext;
		(VkPipelineInputAssemblyStateCreateFlags)0,						// VkPipelineInputAssemblyStateCreateFlags     flags;
		topology,														// VkPrimitiveTopology                         topology;
		VK_FALSE,														// VkBool32                                    primitiveRestartEnable;
	};

	const VkViewport viewport = makeViewport(
		0.0f, 0.0f,
		static_cast<float>(renderSize.x()), static_cast<float>(renderSize.y()),
		0.0f, 1.0f);

	const VkRect2D scissor = {
		makeOffset2D(0, 0),
		makeExtent2D(renderSize.x(), renderSize.y()),
	};

	const VkPipelineViewportStateCreateInfo pipelineViewportStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,			// VkStructureType                             sType;
		DE_NULL,														// const void*                                 pNext;
		(VkPipelineViewportStateCreateFlags)0,							// VkPipelineViewportStateCreateFlags          flags;
		1u,																// uint32_t                                    viewportCount;
		&viewport,														// const VkViewport*                           pViewports;
		1u,																// uint32_t                                    scissorCount;
		&scissor,														// const VkRect2D*                             pScissors;
	};

	const VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,		// VkStructureType                          sType;
		DE_NULL,														// const void*                              pNext;
		(VkPipelineRasterizationStateCreateFlags)0,						// VkPipelineRasterizationStateCreateFlags  flags;
		VK_FALSE,														// VkBool32                                 depthClampEnable;
		VK_FALSE,														// VkBool32                                 rasterizerDiscardEnable;
		VK_POLYGON_MODE_FILL,											// VkPolygonMode							polygonMode;
		VK_CULL_MODE_NONE,												// VkCullModeFlags							cullMode;
		VK_FRONT_FACE_COUNTER_CLOCKWISE,								// VkFrontFace								frontFace;
		VK_FALSE,														// VkBool32									depthBiasEnable;
		0.0f,															// float									depthBiasConstantFactor;
		0.0f,															// float									depthBiasClamp;
		0.0f,															// float									depthBiasSlopeFactor;
		1.0f,															// float									lineWidth;
	};

	const VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,		// VkStructureType							sType;
		DE_NULL,														// const void*								pNext;
		(VkPipelineMultisampleStateCreateFlags)0,						// VkPipelineMultisampleStateCreateFlags	flags;
		numSamples,														// VkSampleCountFlagBits					rasterizationSamples;
		VK_FALSE,														// VkBool32									sampleShadingEnable;
		0.0f,															// float									minSampleShading;
		DE_NULL,														// const VkSampleMask*						pSampleMask;
		VK_FALSE,														// VkBool32									alphaToCoverageEnable;
		VK_FALSE														// VkBool32									alphaToOneEnable;
	};

	const VkStencilOpState stencilOpState = makeStencilOpState(
		VK_STENCIL_OP_KEEP,				// stencil fail
		VK_STENCIL_OP_KEEP,				// depth & stencil pass
		VK_STENCIL_OP_KEEP,				// depth only fail
		VK_COMPARE_OP_ALWAYS,			// compare op
		0u,								// compare mask
		0u,								// write mask
		0u);							// reference

	VkPipelineDepthStencilStateCreateInfo pipelineDepthStencilStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO,		// VkStructureType							sType;
		DE_NULL,														// const void*								pNext;
		(VkPipelineDepthStencilStateCreateFlags)0,						// VkPipelineDepthStencilStateCreateFlags	flags;
		VK_FALSE,														// VkBool32									depthTestEnable;
		VK_FALSE,														// VkBool32									depthWriteEnable;
		VK_COMPARE_OP_LESS,												// VkCompareOp								depthCompareOp;
		VK_FALSE,														// VkBool32									depthBoundsTestEnable;
		VK_FALSE,														// VkBool32									stencilTestEnable;
		stencilOpState,													// VkStencilOpState							front;
		stencilOpState,													// VkStencilOpState							back;
		0.0f,															// float									minDepthBounds;
		1.0f,															// float									maxDepthBounds;
	};

	const VkColorComponentFlags colorComponentsAll = VK_COLOR_COMPONENT_R_BIT | VK_COLOR_COMPONENT_G_BIT | VK_COLOR_COMPONENT_B_BIT | VK_COLOR_COMPONENT_A_BIT;
	// Number of blend attachments must equal the number of color attachments during any subpass.
	const VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState =
	{
		VK_FALSE,						// VkBool32					blendEnable;
		VK_BLEND_FACTOR_ONE,			// VkBlendFactor			srcColorBlendFactor;
		VK_BLEND_FACTOR_ZERO,			// VkBlendFactor			dstColorBlendFactor;
		VK_BLEND_OP_ADD,				// VkBlendOp				colorBlendOp;
		VK_BLEND_FACTOR_ONE,			// VkBlendFactor			srcAlphaBlendFactor;
		VK_BLEND_FACTOR_ZERO,			// VkBlendFactor			dstAlphaBlendFactor;
		VK_BLEND_OP_ADD,				// VkBlendOp				alphaBlendOp;
		colorComponentsAll,				// VkColorComponentFlags	colorWriteMask;
	};

	const VkPipelineColorBlendStateCreateInfo pipelineColorBlendStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,		// VkStructureType								sType;
		DE_NULL,														// const void*									pNext;
		(VkPipelineColorBlendStateCreateFlags)0,						// VkPipelineColorBlendStateCreateFlags			flags;
		VK_FALSE,														// VkBool32										logicOpEnable;
		VK_LOGIC_OP_COPY,												// VkLogicOp									logicOp;
		1u,																// deUint32										attachmentCount;
		&pipelineColorBlendAttachmentState,								// const VkPipelineColorBlendAttachmentState*	pAttachments;
		{ 0.0f, 0.0f, 0.0f, 0.0f },										// float										blendConstants[4];
	};

	const VkPipelineShaderStageCreateInfo pShaderStages[] =
	{
		{
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,		// VkStructureType						sType;
			DE_NULL,													// const void*							pNext;
			(VkPipelineShaderStageCreateFlags)0,						// VkPipelineShaderStageCreateFlags		flags;
			VK_SHADER_STAGE_VERTEX_BIT,									// VkShaderStageFlagBits				stage;
			vertexModule,												// VkShaderModule						module;
			"main",														// const char*							pName;
			DE_NULL,													// const VkSpecializationInfo*			pSpecializationInfo;
		},
		{
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,		// VkStructureType						sType;
			DE_NULL,													// const void*							pNext;
			(VkPipelineShaderStageCreateFlags)0,						// VkPipelineShaderStageCreateFlags		flags;
			VK_SHADER_STAGE_FRAGMENT_BIT,								// VkShaderStageFlagBits				stage;
			fragmentModule,												// VkShaderModule						module;
			"main",														// const char*							pName;
			DE_NULL,													// const VkSpecializationInfo*			pSpecializationInfo;
		}
	};

	DE_ASSERT(numSubpasses > 0u);

	std::vector<VkGraphicsPipelineCreateInfo>	graphicsPipelineInfos	(0);
	std::vector<VkPipeline>						rawPipelines			(numSubpasses, DE_NULL);

	{
		const VkPipelineCreateFlags firstPipelineFlags = (numSubpasses > 1u ? VK_PIPELINE_CREATE_ALLOW_DERIVATIVES_BIT
																			: (VkPipelineCreateFlagBits)0);

		VkGraphicsPipelineCreateInfo createInfo =
		{
			VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,	// VkStructureType									sType;
			DE_NULL,											// const void*										pNext;
			firstPipelineFlags,									// VkPipelineCreateFlags							flags;
			DE_LENGTH_OF_ARRAY(pShaderStages),					// deUint32											stageCount;
			pShaderStages,										// const VkPipelineShaderStageCreateInfo*			pStages;
			&vertexInputStateInfo,								// const VkPipelineVertexInputStateCreateInfo*		pVertexInputState;
			&pipelineInputAssemblyStateInfo,					// const VkPipelineInputAssemblyStateCreateInfo*	pInputAssemblyState;
			DE_NULL,											// const VkPipelineTessellationStateCreateInfo*		pTessellationState;
			&pipelineViewportStateInfo,							// const VkPipelineViewportStateCreateInfo*			pViewportState;
			&pipelineRasterizationStateInfo,					// const VkPipelineRasterizationStateCreateInfo*	pRasterizationState;
			&pipelineMultisampleStateInfo,						// const VkPipelineMultisampleStateCreateInfo*		pMultisampleState;
			&pipelineDepthStencilStateInfo,						// const VkPipelineDepthStencilStateCreateInfo*		pDepthStencilState;
			&pipelineColorBlendStateInfo,						// const VkPipelineColorBlendStateCreateInfo*		pColorBlendState;
			DE_NULL,											// const VkPipelineDynamicStateCreateInfo*			pDynamicState;
			pipelineLayout,										// VkPipelineLayout									layout;
			renderPass,											// VkRenderPass										renderPass;
			0u,													// deUint32											subpass;
			DE_NULL,											// VkPipeline										basePipelineHandle;
			-1,													// deInt32											basePipelineIndex;
		};

		graphicsPipelineInfos.push_back(createInfo);

		createInfo.flags				= VK_PIPELINE_CREATE_DERIVATIVE_BIT;
		createInfo.basePipelineIndex	= 0;

		for (deUint32 subpassNdx = 1u; subpassNdx < numSubpasses; ++subpassNdx)
		{
			createInfo.subpass = subpassNdx;
			graphicsPipelineInfos.push_back(createInfo);
		}
	}

	VK_CHECK(vk.createGraphicsPipelines(device, DE_NULL, static_cast<deUint32>(graphicsPipelineInfos.size()), &graphicsPipelineInfos[0], DE_NULL, &rawPipelines[0]));

	std::vector<PipelineSp>	pipelines;

	for (std::vector<VkPipeline>::const_iterator it = rawPipelines.begin(); it != rawPipelines.end(); ++it)
		pipelines.push_back(makeSharedPtr(Move<VkPipeline>(check<VkPipeline>(*it), Deleter<VkPipeline>(vk, device, DE_NULL))));

	return pipelines;
}